

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

uint add_list_to_class(uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,
                      uint32_t xoptions,compile_block_8 *cb,uint32_t *p,uint except)

{
  uint uVar1;
  uint local_38;
  uint local_34;
  uint n;
  uint n8;
  uint32_t *p_local;
  compile_block_8 *cb_local;
  uint32_t xoptions_local;
  uint32_t options_local;
  PCRE2_UCHAR8 **uchardptr_local;
  uint8_t *classbits_local;
  
  local_34 = 0;
  for (_n = p; *_n != 0xffffffff; _n = _n + (local_38 + 1)) {
    local_38 = 0;
    if (*_n != except) {
      for (; _n[local_38 + 1] == *_n + local_38 + 1; local_38 = local_38 + 1) {
      }
      cb->class_range_start = *_n;
      cb->class_range_end = _n[local_38];
      uVar1 = add_to_class_internal(classbits,uchardptr,options,xoptions,cb,*_n,_n[local_38]);
      local_34 = uVar1 + local_34;
    }
  }
  return local_34;
}

Assistant:

static unsigned int
add_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr, uint32_t options,
  uint32_t xoptions, compile_block *cb, const uint32_t *p, unsigned int except)
{
unsigned int n8 = 0;
while (p[0] < NOTACHAR)
  {
  unsigned int n = 0;
  if (p[0] != except)
    {
    while(p[n+1] == p[0] + n + 1) n++;
    cb->class_range_start = p[0];
    cb->class_range_end = p[n];
    n8 += add_to_class_internal(classbits, uchardptr, options, xoptions, cb,
      p[0], p[n]);
    }
  p += n + 1;
  }
return n8;
}